

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::ctor_inject::ctor_inject(ctor_inject *this,type *service1)

{
  int iVar1;
  type psVar2;
  undefined4 extraout_var;
  unique_id local_88;
  undefined8 local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  char *local_30;
  
  this->ctor_num = 1;
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x247);
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_0015fea8;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_30 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_70 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service1);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_80 = CONCAT44(extraout_var,iVar1);
  local_88 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_48,&local_78,0x247,1,2,&local_80,"service1->id()",&local_88,"id_of<impl1>::id()"
            );
  return;
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1) {
        ctor_num = 1;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
    }